

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenRegVm_X86.cpp
# Opt level: O0

void GenCodeCmdSetRange(CodeGenRegVmContext *ctx,RegVmCmd cmd)

{
  CodeGenRegVmContext *ctx_local;
  RegVmCmd cmd_local;
  
  ctx_local._1_1_ = cmd.rA;
  ctx_local._3_1_ = cmd.rC;
  ctx_local._4_4_ = cmd.argument;
  switch((ulong)cmd >> 0x10 & 0xff) {
  case 0:
    EMIT_OP_REG_RPTR(&ctx->ctx,o_mov64,rEAX,sQWORD,rEBX,(uint)ctx_local._1_1_ << 3);
    EMIT_OP_REG_RPTR(&ctx->ctx,o_mov64,rEDI,sQWORD,rEBX,(uint)ctx_local._3_1_ << 3);
    EMIT_OP_REG_NUM(&ctx->ctx,o_mov,rECX,ctx_local._4_4_);
    EMIT_OP(&ctx->ctx,o_rep_stosq);
    break;
  case 1:
    EMIT_OP_REG_RPTR(&ctx->ctx,o_cvtsd2ss,rXMM0,sQWORD,rEBX,(uint)ctx_local._1_1_ << 3);
    EMIT_OP_REG_REG(&ctx->ctx,o_movd,rEAX,rXMM0);
    EMIT_OP_REG_RPTR(&ctx->ctx,o_mov64,rEDI,sQWORD,rEBX,(uint)ctx_local._3_1_ << 3);
    EMIT_OP_REG_NUM(&ctx->ctx,o_mov,rECX,ctx_local._4_4_);
    EMIT_OP(&ctx->ctx,o_rep_stosd);
    break;
  case 2:
    EMIT_OP_REG_RPTR(&ctx->ctx,o_mov64,rEAX,sQWORD,rEBX,(uint)ctx_local._1_1_ << 3);
    EMIT_OP_REG_RPTR(&ctx->ctx,o_mov64,rEDI,sQWORD,rEBX,(uint)ctx_local._3_1_ << 3);
    EMIT_OP_REG_NUM(&ctx->ctx,o_mov,rECX,ctx_local._4_4_);
    EMIT_OP(&ctx->ctx,o_rep_stosq);
    break;
  case 3:
    EMIT_OP_REG_RPTR(&ctx->ctx,o_mov,rEAX,sDWORD,rEBX,(uint)ctx_local._1_1_ << 3);
    EMIT_OP_REG_RPTR(&ctx->ctx,o_mov64,rEDI,sQWORD,rEBX,(uint)ctx_local._3_1_ << 3);
    EMIT_OP_REG_NUM(&ctx->ctx,o_mov,rECX,ctx_local._4_4_);
    EMIT_OP(&ctx->ctx,o_rep_stosd);
    break;
  case 4:
    EMIT_OP_REG_RPTR(&ctx->ctx,o_mov,rEAX,sDWORD,rEBX,(uint)ctx_local._1_1_ << 3);
    EMIT_OP_REG_RPTR(&ctx->ctx,o_mov64,rEDI,sQWORD,rEBX,(uint)ctx_local._3_1_ << 3);
    EMIT_OP_REG_NUM(&ctx->ctx,o_mov,rECX,ctx_local._4_4_);
    EMIT_OP(&ctx->ctx,o_rep_stosw);
    break;
  case 5:
    EMIT_OP_REG_RPTR(&ctx->ctx,o_mov,rEAX,sDWORD,rEBX,(uint)ctx_local._1_1_ << 3);
    EMIT_OP_REG_RPTR(&ctx->ctx,o_mov64,rEDI,sQWORD,rEBX,(uint)ctx_local._3_1_ << 3);
    EMIT_OP_REG_NUM(&ctx->ctx,o_mov,rECX,ctx_local._4_4_);
    EMIT_OP(&ctx->ctx,o_rep_stosb);
    break;
  default:
    __assert_fail("!\"unknown type\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGenRegVm_X86.cpp"
                  ,0x614,"void GenCodeCmdSetRange(CodeGenRegVmContext &, RegVmCmd)");
  }
  return;
}

Assistant:

void GenCodeCmdSetRange(CodeGenRegVmContext &ctx, RegVmCmd cmd)
{
#if defined(_M_X64)
	switch(RegVmSetRangeType(cmd.rB))
	{
	case rvsrDouble:
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, rRAX, sQWORD, rREG, cmd.rA * 8); // Load double value as long
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, rRDI, sQWORD, rREG, cmd.rC * 8); // Load target pointer
		EMIT_OP_REG_NUM(ctx.ctx, o_mov, rECX, cmd.argument);
		EMIT_OP(ctx.ctx, o_rep_stosq);
		break;
	case rvsrFloat:
		EMIT_OP_REG_RPTR(ctx.ctx, o_cvtsd2ss, rXMM0, sQWORD, rREG, cmd.rA * 8); // Load double as float
		EMIT_OP_REG_REG(ctx.ctx, o_movd, rEAX, rXMM0); // Move to integer register
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, rRDI, sQWORD, rREG, cmd.rC * 8); // Load target pointer
		EMIT_OP_REG_NUM(ctx.ctx, o_mov, rECX, cmd.argument);
		EMIT_OP(ctx.ctx, o_rep_stosd);
		break;
	case rvsrLong:
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, rRAX, sQWORD, rREG, cmd.rA * 8); // Load long value
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, rRDI, sQWORD, rREG, cmd.rC * 8); // Load target pointer
		EMIT_OP_REG_NUM(ctx.ctx, o_mov, rECX, cmd.argument);
		EMIT_OP(ctx.ctx, o_rep_stosq);
		break;
	case rvsrInt:
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEAX, sDWORD, rREG, cmd.rA * 8); // Load integer
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, rRDI, sQWORD, rREG, cmd.rC * 8); // Load target pointer
		EMIT_OP_REG_NUM(ctx.ctx, o_mov, rECX, cmd.argument);
		EMIT_OP(ctx.ctx, o_rep_stosd);
		break;
	case rvsrShort:
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEAX, sDWORD, rREG, cmd.rA * 8); // Load integer
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, rRDI, sQWORD, rREG, cmd.rC * 8); // Load target pointer
		EMIT_OP_REG_NUM(ctx.ctx, o_mov, rECX, cmd.argument);
		EMIT_OP(ctx.ctx, o_rep_stosw);
		break;
	case rvsrChar:
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEAX, sDWORD, rREG, cmd.rA * 8); // Load integer
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, rRDI, sQWORD, rREG, cmd.rC * 8); // Load target pointer
		EMIT_OP_REG_NUM(ctx.ctx, o_mov, rECX, cmd.argument);
		EMIT_OP(ctx.ctx, o_rep_stosb);
		break;
	default:
		assert(!"unknown type");
	}
#else
	switch(RegVmSetRangeType(cmd.rB))
	{
	case rvsrDouble:
	case rvsrLong:
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEAX, sDWORD, rREG, cmd.rA * 8);
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEDX, sDWORD, rREG, cmd.rA * 8 + 4);

		EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEDI, sDWORD, rREG, cmd.rC * 8); // Load target pointer
		EMIT_OP_REG_RPTR(ctx.ctx, o_lea, rECX, sDWORD, rEDI, cmd.argument * 8);

		EMIT_LABEL(ctx.ctx, ctx.labelCount);
		EMIT_OP_REG_REG(ctx.ctx, o_cmp, rEDI, rECX);
		EMIT_OP_LABEL(ctx.ctx, o_je, ctx.labelCount + 1, true);

		EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rEDI, 0, rEAX);
		EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rEDI, 4, rEDX);

		EMIT_OP_REG_NUM(ctx.ctx, o_add, rEDI, 8);
		EMIT_REG_READ(ctx.ctx, rEDI); // Mark that register is used (by next iteration)

		EMIT_OP_LABEL(ctx.ctx, o_jmp, ctx.labelCount, true);
		EMIT_LABEL(ctx.ctx, ctx.labelCount + 1);

		ctx.labelCount += 2;
		break;
	case rvsrFloat:
		EMIT_OP_REG_RPTR(ctx.ctx, o_cvtsd2ss, rXMM0, sQWORD, rREG, cmd.rA * 8); // Load double as float
		EMIT_OP_REG_REG(ctx.ctx, o_movd, rEAX, rXMM0); // Move to integer register
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEDI, sDWORD, rREG, cmd.rC * 8); // Load target pointer
		EMIT_OP_REG_NUM(ctx.ctx, o_mov, rECX, cmd.argument);
		EMIT_OP(ctx.ctx, o_rep_stosd);
		break;
	case rvsrInt:
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEAX, sDWORD, rREG, cmd.rA * 8); // Load integer
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEDI, sDWORD, rREG, cmd.rC * 8); // Load target pointer
		EMIT_OP_REG_NUM(ctx.ctx, o_mov, rECX, cmd.argument);
		EMIT_OP(ctx.ctx, o_rep_stosd);
		break;
	case rvsrShort:
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEAX, sDWORD, rREG, cmd.rA * 8); // Load integer
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEDI, sDWORD, rREG, cmd.rC * 8); // Load target pointer
		EMIT_OP_REG_NUM(ctx.ctx, o_mov, rECX, cmd.argument);
		EMIT_OP(ctx.ctx, o_rep_stosw);
		break;
	case rvsrChar:
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEAX, sDWORD, rREG, cmd.rA * 8); // Load integer
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEDI, sDWORD, rREG, cmd.rC * 8); // Load target pointer
		EMIT_OP_REG_NUM(ctx.ctx, o_mov, rECX, cmd.argument);
		EMIT_OP(ctx.ctx, o_rep_stosb);
		break;
	default:
		assert(!"unknown type");
	}
#endif
}